

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<Js::PropertyRecord_const*>
          (BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key,DictionaryPropertyDescriptor<int> *value)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  DictionaryStats *this_00;
  uint uVar6;
  
  lVar2 = *(long *)this;
  uVar5 = 0;
  if (lVar2 != 0) {
    uVar5 = BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((*key)->hash * 2 + 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar6 = *(uint *)(lVar2 + (ulong)uVar5 * 4);
    uVar5 = 0;
    if (-1 < (int)uVar6) {
      uVar5 = 0;
      do {
        if (*(PropertyRecord **)(*(long *)(this + 8) + 0x18 + (ulong)uVar6 * 0x20) == *key) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_00db927c;
        }
        uVar5 = uVar5 + 1;
        uVar6 = *(uint *)((ulong)uVar6 * 0x20 + *(long *)(this + 8) + 0x10);
      } while (-1 < (int)uVar6);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar6 = 0xffffffff;
LAB_00db927c:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar5);
  }
  if (-1 < (int)uVar6) {
    puVar1 = (undefined8 *)(*(long *)(this + 8) + (ulong)uVar6 * 0x20);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    value->flags = (char)uVar3;
    value->Attributes = (char)((ulong)uVar3 >> 8);
    *(short *)&value->field_0x2 = (short)((ulong)uVar3 >> 0x10);
    value->Data = (int)((ulong)uVar3 >> 0x20);
    value->Getter = (int)uVar4;
    value->Setter = (int)((ulong)uVar4 >> 0x20);
  }
  return -1 < (int)uVar6;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }